

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForkJoin.cpp
# Opt level: O2

vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> * __thiscall
dg::ForkJoinAnalysis::matchJoin
          (vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_> *__return_storage_ptr__
          ,ForkJoinAnalysis *this,Value *joinVal)

{
  long lVar1;
  _Base_ptr p_Var2;
  raw_ostream *this_00;
  Value *llvmcall;
  value_type local_58;
  _Rb_tree<dg::pta::PSNodeFork_*,_dg::pta::PSNodeFork_*,_std::_Identity<dg::pta::PSNodeFork_*>,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
  local_50;
  
  lVar1 = *(long *)this;
  if (*(int *)(lVar1 + 0x70) != 3) {
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lVar1 = dg::pta::LLVMPointerGraphBuilder::findJoin(*(CallInst **)(lVar1 + 0x88));
    std::
    _Rb_tree<dg::pta::PSNodeFork_*,_dg::pta::PSNodeFork_*,_std::_Identity<dg::pta::PSNodeFork_*>,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
    ::_Rb_tree(&local_50,
               (_Rb_tree<dg::pta::PSNodeFork_*,_dg::pta::PSNodeFork_*,_std::_Identity<dg::pta::PSNodeFork_*>,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
                *)(lVar1 + 0xf0));
    for (p_Var2 = local_50._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &local_50._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      local_58 = *(value_type *)(*(long *)(*(long *)(p_Var2 + 1) + 0xe8) + 0x18);
      std::vector<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>::push_back
                (__return_storage_ptr__,&local_58);
    }
    std::
    _Rb_tree<dg::pta::PSNodeFork_*,_dg::pta::PSNodeFork_*,_std::_Identity<dg::pta::PSNodeFork_*>,_std::less<dg::pta::PSNodeFork_*>,_std::allocator<dg::pta::PSNodeFork_*>_>
    ::~_Rb_tree(&local_50);
    return __return_storage_ptr__;
  }
  this_00 = (raw_ostream *)llvm::errs();
  llvm::raw_ostream::operator<<(this_00,"ForkJoin analysis does not support SVF yet\n");
  abort();
}

Assistant:

std::vector<const llvm::Value *>
ForkJoinAnalysis::matchJoin(const llvm::Value *joinVal) {
    using namespace llvm;

    if (_PTA->getOptions().isSVF()) {
        errs() << "ForkJoin analysis does not support SVF yet\n";
        abort();
    }

    auto *dgPTA = static_cast<DGLLVMPointerAnalysis *>(_PTA);
    std::vector<const llvm::Value *> threads;

    auto *const builder = dgPTA->getBuilder();
    const auto *const joinCall = cast<CallInst>(joinVal);
    auto *const joinNode = builder->findJoin(joinCall);
    for (auto *const forkNode : joinNode->forks()) {
        auto *const llvmcall = forkNode->callInst()->getUserData<llvm::Value>();
        assert(isa<CallInst>(llvmcall));
        threads.push_back(llvmcall);
    }

    return threads;

    // const auto calledVal = joinCall->getCalledValue();
    // if (const auto joinF = dyn_cast<Function>(calledVal)) {
    //    assert(joinF->getName().equals("pthread_join")
    //            && "Invalid function taken as pthread join");

    //} else {
    //    errs() << "Join via function call not implemented yet\n";
    //    abort();
    //}
}